

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O3

bool __thiscall CDirectiveData::Validate(CDirectiveData *this)

{
  long lVar1;
  bool bVar2;
  u64 uVar3;
  size_t bytes;
  long lVar4;
  ulong uVar5;
  int num;
  int local_2c;
  
  uVar3 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar3;
  if (this->TotalAmount != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      lVar1 = *(long *)(&this->Entries->String + lVar4);
      if (*(char *)((long)this->Entries + lVar4 + -8) == '\0') {
        bVar2 = evalExpression(this->ExpData + lVar1,&local_2c,true);
        if (!bVar2) {
          return false;
        }
        bytes = this->UnitSize;
      }
      else {
        bytes = this->UnitSize * (this->StrData).Entries[lVar1].len;
      }
      FileManager::advanceMemory(g_fileManager,bytes);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < this->TotalAmount);
  }
  return false;
}

Assistant:

bool CDirectiveData::Validate()
{
	RamPos = g_fileManager->getVirtualAddress();

	int num;
	for (size_t i = 0; i < TotalAmount; i++)
	{
		if (Entries[i].String == false)
		{
			if (evalExpression(ExpData[Entries[i].num],num,true) == false)
				return false;
			g_fileManager->advanceMemory(UnitSize);
		} else {
			g_fileManager->advanceMemory(StrData.GetLen(Entries[i].num)*UnitSize);
		}
	}

	return false;
}